

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void process_pending_handles(Curl_multi *multi)

{
  _Bool _Var1;
  Curl_easy *data_00;
  Curl_easy *data;
  Curl_multi *pCStack_10;
  uint mid;
  Curl_multi *multi_local;
  
  pCStack_10 = multi;
  _Var1 = Curl_uint_bset_first(&multi->pending,(uint *)((long)&data + 4));
  if (_Var1) {
    do {
      data_00 = Curl_multi_get_easy(pCStack_10,data._4_4_);
      if (data_00 != (Curl_easy *)0x0) {
        move_pending_to_connect(pCStack_10,data_00);
      }
      _Var1 = Curl_uint_bset_next(&pCStack_10->pending,data._4_4_,(uint *)((long)&data + 4));
    } while (_Var1);
  }
  return;
}

Assistant:

static void process_pending_handles(struct Curl_multi *multi)
{
  unsigned int mid;
  if(Curl_uint_bset_first(&multi->pending, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      DEBUGASSERT(data);
      if(data)
        move_pending_to_connect(multi, data);
    }
    while(Curl_uint_bset_next(&multi->pending, mid, &mid));
  }
}